

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

CURLcode cf_tcp_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uint uVar1;
  void *pvVar2;
  curl_trc_feat *pcVar3;
  void *pvVar4;
  _Bool _Var5;
  uint uVar6;
  CURLcode CVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  socklen_t __len;
  char *pcVar11;
  curltime cVar12;
  char buffer [256];
  
  if ((cf->field_0x24 & 1) == 0) {
    if (blocking) {
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    pvVar2 = cf->ctx;
    *done = false;
    iVar8 = *(int *)((long)pvVar2 + 0x98);
    if (iVar8 == -1) {
      CVar7 = cf_socket_open(cf,data);
      if (CVar7 == CURLE_OK) {
        if ((cf->field_0x24 & 1) != 0) goto LAB_00115492;
        pvVar4 = cf->ctx;
        buffer[0] = '\x01';
        buffer[1] = '\0';
        buffer[2] = '\0';
        buffer[3] = '\0';
        iVar8 = *(int *)((long)pvVar4 + 0x98);
        if ((*(uint *)&cf->conn->bits >> 0x17 & 1) == 0) {
          __len = *(socklen_t *)((long)pvVar4 + 0x14);
        }
        else {
          iVar8 = setsockopt(iVar8,6,0x1e,buffer,4);
          if ((((data != (Curl_easy *)0x0) && (iVar8 < 0)) &&
              (((data->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
              (0 < pcVar3->log_level)))) {
            Curl_infof(data,"Failed to enable TCP Fast Open on fd %d",
                       (ulong)*(uint *)((long)pvVar4 + 0x98));
          }
          __len = *(socklen_t *)((long)pvVar4 + 0x14);
          iVar8 = *(int *)((long)pvVar4 + 0x98);
        }
        iVar9 = connect(iVar8,(sockaddr *)((long)pvVar4 + 0x18),__len);
        piVar10 = __errno_location();
        iVar8 = *piVar10;
        set_local_ip(cf,data);
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
            ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)
             ))) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"local address %s port %d...",(long)pvVar2 + 0xca,
                            (ulong)*(uint *)((long)pvVar2 + 0xfc));
        }
        if (iVar9 != -1) {
          iVar8 = *(curl_socket_t *)((long)pvVar2 + 0x98);
          CVar7 = CURLE_OK;
          goto LAB_001153ee;
        }
        CVar7 = socket_connect_result(data,(char *)((long)pvVar2 + 0x9c),iVar8);
        goto LAB_00115665;
      }
    }
    else {
      CVar7 = CURLE_COULDNT_CONNECT;
LAB_001153ee:
      uVar6 = Curl_socket_check(-1,-1,iVar8,0);
      if (uVar6 != 2) {
        if (uVar6 == 0) {
          if (data == (Curl_easy *)0x0) {
            return CURLE_OK;
          }
          if (((data->set).field_0x8cd & 0x10) == 0) {
            return CURLE_OK;
          }
          pcVar3 = (data->state).feat;
          if ((pcVar3 != (curl_trc_feat *)0x0) && (pcVar3->log_level < 1)) {
            return CURLE_OK;
          }
          if (cf->cft->log_level < 1) {
            return CURLE_OK;
          }
          pcVar11 = "not connected yet";
          goto LAB_00115560;
        }
        if (((cf->conn->bits).field_0x2 & 0x80) == 0) {
          if ((uVar6 & 4) == 0) goto LAB_00115665;
          verifyconnect(*(curl_socket_t *)((long)pvVar2 + 0x98),(int *)((long)pvVar2 + 0x130));
          CVar7 = CURLE_COULDNT_CONNECT;
          goto LAB_0011566d;
        }
      }
      _Var5 = verifyconnect(*(curl_socket_t *)((long)pvVar2 + 0x98),(int *)((long)pvVar2 + 0x130));
      if (_Var5) {
        cVar12 = Curl_now();
        *(time_t *)((long)pvVar2 + 0x110) = cVar12.tv_sec;
        *(int *)((long)pvVar2 + 0x118) = cVar12.tv_usec;
        set_local_ip(cf,data);
        *done = true;
        cf->field_0x24 = cf->field_0x24 | 1;
        if (data == (Curl_easy *)0x0) {
          return CURLE_OK;
        }
        if (((data->set).field_0x8cd & 0x10) == 0) {
          return CURLE_OK;
        }
        pcVar3 = (data->state).feat;
        if ((pcVar3 != (curl_trc_feat *)0x0) && (pcVar3->log_level < 1)) {
          return CURLE_OK;
        }
        if (cf->cft->log_level < 1) {
          return CURLE_OK;
        }
        pcVar11 = "connected";
LAB_00115560:
        Curl_trc_cf_infof(data,cf,pcVar11);
        return CURLE_OK;
      }
LAB_00115665:
      if (CVar7 == CURLE_OK) goto LAB_00115496;
    }
LAB_0011566d:
    if (*(int *)((long)pvVar2 + 0x130) != 0) {
      set_local_ip(cf,data);
      iVar8 = *(int *)((long)pvVar2 + 0x130);
      (data->state).os_errno = iVar8;
      piVar10 = __errno_location();
      *piVar10 = iVar8;
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
      {
        uVar6 = *(uint *)((long)pvVar2 + 0xf8);
        uVar1 = *(uint *)((long)pvVar2 + 0xfc);
        pcVar11 = Curl_strerror(iVar8,buffer,0x100);
        Curl_infof(data,"connect to %s port %u from %s port %d failed: %s",(long)pvVar2 + 0x9c,
                   (ulong)uVar6,(long)pvVar2 + 0xca,(ulong)uVar1,pcVar11);
      }
    }
    if (*(int *)((long)pvVar2 + 0x98) != -1) {
      socket_close(data,cf->conn,1,*(int *)((long)pvVar2 + 0x98));
      *(undefined4 *)((long)pvVar2 + 0x98) = 0xffffffff;
    }
    *done = false;
  }
  else {
LAB_00115492:
    *done = true;
LAB_00115496:
    CVar7 = CURLE_OK;
  }
  return CVar7;
}

Assistant:

static CURLcode cf_tcp_connect(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               bool blocking, bool *done)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_COULDNT_CONNECT;
  int rc = 0;

  (void)data;
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* TODO: need to support blocking connect? */
  if(blocking)
    return CURLE_UNSUPPORTED_PROTOCOL;

  *done = FALSE; /* a very negative world view is best */
  if(ctx->sock == CURL_SOCKET_BAD) {
    int error;

    result = cf_socket_open(cf, data);
    if(result)
      goto out;

    if(cf->connected) {
      *done = TRUE;
      return CURLE_OK;
    }

    /* Connect TCP socket */
    rc = do_connect(cf, data, cf->conn->bits.tcp_fastopen);
    error = SOCKERRNO;
    set_local_ip(cf, data);
    CURL_TRC_CF(data, cf, "local address %s port %d...",
                ctx->ip.local_ip, ctx->ip.local_port);
    if(-1 == rc) {
      result = socket_connect_result(data, ctx->ip.remote_ip, error);
      goto out;
    }
  }

#ifdef mpeix
  /* Call this function once now, and ignore the results. We do this to
     "clear" the error state on the socket so that we can later read it
     reliably. This is reported necessary on the MPE/iX operating
     system. */
  (void)verifyconnect(ctx->sock, NULL);
#endif
  /* check socket for connect */
  rc = SOCKET_WRITABLE(ctx->sock, 0);

  if(rc == 0) { /* no connection yet */
    CURL_TRC_CF(data, cf, "not connected yet");
    return CURLE_OK;
  }
  else if(rc == CURL_CSELECT_OUT || cf->conn->bits.tcp_fastopen) {
    if(verifyconnect(ctx->sock, &ctx->error)) {
      /* we are connected with TCP, awesome! */
      ctx->connected_at = Curl_now();
      set_local_ip(cf, data);
      *done = TRUE;
      cf->connected = TRUE;
      CURL_TRC_CF(data, cf, "connected");
      return CURLE_OK;
    }
  }
  else if(rc & CURL_CSELECT_ERR) {
    (void)verifyconnect(ctx->sock, &ctx->error);
    result = CURLE_COULDNT_CONNECT;
  }

out:
  if(result) {
    if(ctx->error) {
      set_local_ip(cf, data);
      data->state.os_errno = ctx->error;
      SET_SOCKERRNO(ctx->error);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      {
        char buffer[STRERROR_LEN];
        infof(data, "connect to %s port %u from %s port %d failed: %s",
              ctx->ip.remote_ip, ctx->ip.remote_port,
              ctx->ip.local_ip, ctx->ip.local_port,
              Curl_strerror(ctx->error, buffer, sizeof(buffer)));
      }
#endif
    }
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
    *done = FALSE;
  }
  return result;
}